

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O2

void nosimd::arithmetic::add<short>(short *pSrc1,short *pSrc2,short *pDst,int len)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (pSrc1 == pDst) {
    uVar2 = (ulong)(uint)len;
    if (len < 1) {
      uVar2 = uVar1;
    }
    for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      pDst[uVar1] = pDst[uVar1] + pSrc2[uVar1];
    }
  }
  else {
    if (0 < len) {
      uVar1 = (ulong)(uint)len;
    }
    uVar2 = 0;
    if (pSrc2 == pDst) {
      for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        pDst[uVar2] = pDst[uVar2] + pSrc1[uVar2];
      }
    }
    else {
      for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
        pDst[uVar2] = pSrc2[uVar2] + pSrc1[uVar2];
      }
    }
  }
  return;
}

Assistant:

inline void add(const _T * pSrc1, const _T * pSrc2, _T * pDst, int len)
        {
            if (pSrc1 == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] += pSrc2[i];
            }
            else if(pSrc2 == pDst)
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] += pSrc1[i];
            }
            else
            {
                for (int i = 0; i < len; ++i)
                    pDst[i] = pSrc1[i] + pSrc2[i];
            }
        }